

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  uint uVar7;
  ulong uVar8;
  Geometry *pGVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 (*pauVar15) [16];
  uint uVar16;
  int iVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  RayHitK<8> *pRVar20;
  long lVar21;
  Scene *pSVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined4 uVar28;
  ulong unaff_R12;
  long lVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  float fVar48;
  float fVar60;
  float fVar61;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar62;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar75;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  float fVar85;
  float fVar86;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar97;
  float fVar98;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar108;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar105 [64];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  undefined1 auVar116 [64];
  float fVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar130;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  float fVar135;
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [64];
  float fVar141;
  undefined1 auVar142 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar152 [64];
  float fVar156;
  float fVar157;
  undefined1 auVar158 [16];
  float fVar165;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar166;
  undefined1 auVar160 [64];
  float fVar167;
  float fVar168;
  undefined1 auVar169 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a1;
  ulong local_13a0;
  ulong local_1398;
  undefined8 local_1390;
  float fStack_1388;
  float fStack_1384;
  undefined8 local_1380;
  float fStack_1378;
  float fStack_1374;
  undefined8 local_1370;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  RayHitK<8> *local_1330;
  ulong local_1328;
  undefined1 local_1320 [16];
  undefined8 *local_1310;
  undefined8 *local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 *local_12b0;
  void *local_12a8;
  RTCRayQueryContext *local_12a0;
  RayHitK<8> *local_1298;
  undefined1 (*local_1290) [32];
  undefined4 local_1288;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 *local_1240;
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar23 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1140._4_4_ = uVar28;
  local_1140._0_4_ = uVar28;
  local_1140._8_4_ = uVar28;
  local_1140._12_4_ = uVar28;
  auVar116 = ZEXT1664(local_1140);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1150._4_4_ = uVar28;
  local_1150._0_4_ = uVar28;
  local_1150._8_4_ = uVar28;
  local_1150._12_4_ = uVar28;
  auVar127 = ZEXT1664(local_1150);
  uVar28 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1160._4_4_ = uVar28;
  local_1160._0_4_ = uVar28;
  local_1160._8_4_ = uVar28;
  local_1160._12_4_ = uVar28;
  auVar134 = ZEXT1664(local_1160);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar32 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1170 = vshufps_avx(auVar32,auVar32,0);
  auVar137 = ZEXT1664(local_1170);
  auVar32 = ZEXT416((uint)(fVar4 * 0.99999964));
  local_1180 = vshufps_avx(auVar32,auVar32,0);
  auVar143 = ZEXT1664(local_1180);
  auVar32 = ZEXT416((uint)(fVar5 * 0.99999964));
  local_1190 = vshufps_avx(auVar32,auVar32,0);
  auVar148 = ZEXT1664(local_1190);
  auVar32 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_11a0 = vshufps_avx(auVar32,auVar32,0);
  auVar152 = ZEXT1664(local_11a0);
  auVar32 = ZEXT416((uint)(fVar4 * 1.0000004));
  local_11b0 = vshufps_avx(auVar32,auVar32,0);
  auVar160 = ZEXT1664(local_11b0);
  auVar32 = ZEXT416((uint)(fVar5 * 1.0000004));
  local_11c0 = vshufps_avx(auVar32,auVar32,0);
  auVar170 = ZEXT1664(local_11c0);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1300 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_12e8 = uVar24 ^ 0x10;
  local_12f0 = uVar27 ^ 0x10;
  local_12f8 = local_1300 ^ 0x10;
  iVar17 = (tray->tnear).field_0.i[k];
  local_1280._4_4_ = iVar17;
  local_1280._0_4_ = iVar17;
  local_1280._8_4_ = iVar17;
  local_1280._12_4_ = iVar17;
  auVar105 = ZEXT1664(local_1280);
  iVar17 = (tray->tfar).field_0.i[k];
  auVar37 = ZEXT1664(CONCAT412(iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17))));
  uVar16 = 1 << ((byte)k & 0x1f);
  local_1308 = (undefined8 *)(mm_lookupmask_ps + ((uVar16 & 0xf) << 4));
  local_1310 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar16 >> 4) * 0x10);
  uVar19 = local_1300;
  local_13a0 = uVar27;
  local_1398 = uVar24;
  local_1330 = ray;
  do {
    do {
      do {
        if (pauVar23 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar15 = pauVar23 + -1;
        pauVar23 = pauVar23 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar15 + 8));
      uVar30 = *(ulong *)*pauVar23;
      do {
        if ((uVar30 & 8) == 0) {
          uVar18 = uVar30 & 0xfffffffffffffff0;
          fVar3 = *(float *)(ray + k * 4 + 0xe0);
          auVar38._4_4_ = fVar3;
          auVar38._0_4_ = fVar3;
          auVar38._8_4_ = fVar3;
          auVar38._12_4_ = fVar3;
          pfVar2 = (float *)(uVar18 + 0x80 + uVar24);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar24);
          auVar32._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar32._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar32._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar32._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar32 = vsubps_avx(auVar32,auVar116._0_16_);
          auVar39._0_4_ = auVar137._0_4_ * auVar32._0_4_;
          auVar39._4_4_ = auVar137._4_4_ * auVar32._4_4_;
          auVar39._8_4_ = auVar137._8_4_ * auVar32._8_4_;
          auVar39._12_4_ = auVar137._12_4_ * auVar32._12_4_;
          auVar32 = vmaxps_avx(auVar105._0_16_,auVar39);
          pfVar2 = (float *)(uVar18 + 0x80 + uVar27);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar27);
          auVar63._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar63._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar63._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar63._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar63,auVar127._0_16_);
          auVar64._0_4_ = auVar143._0_4_ * auVar39._0_4_;
          auVar64._4_4_ = auVar143._4_4_ * auVar39._4_4_;
          auVar64._8_4_ = auVar143._8_4_ * auVar39._8_4_;
          auVar64._12_4_ = auVar143._12_4_ * auVar39._12_4_;
          pfVar2 = (float *)(uVar18 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar19);
          auVar78._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar78._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar78._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar78._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar78,auVar134._0_16_);
          auVar79._0_4_ = auVar148._0_4_ * auVar39._0_4_;
          auVar79._4_4_ = auVar148._4_4_ * auVar39._4_4_;
          auVar79._8_4_ = auVar148._8_4_ * auVar39._8_4_;
          auVar79._12_4_ = auVar148._12_4_ * auVar39._12_4_;
          auVar39 = vmaxps_avx(auVar64,auVar79);
          auVar32 = vmaxps_avx(auVar32,auVar39);
          pfVar2 = (float *)(uVar18 + 0x80 + local_12e8);
          pfVar1 = (float *)(uVar18 + 0x20 + local_12e8);
          auVar65._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar65._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar65._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar65._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar65,auVar116._0_16_);
          auVar66._0_4_ = auVar152._0_4_ * auVar39._0_4_;
          auVar66._4_4_ = auVar152._4_4_ * auVar39._4_4_;
          auVar66._8_4_ = auVar152._8_4_ * auVar39._8_4_;
          auVar66._12_4_ = auVar152._12_4_ * auVar39._12_4_;
          pfVar2 = (float *)(uVar18 + 0x80 + local_12f0);
          pfVar1 = (float *)(uVar18 + 0x20 + local_12f0);
          auVar80._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar80._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar80._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar80._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar80,auVar127._0_16_);
          auVar81._0_4_ = auVar160._0_4_ * auVar39._0_4_;
          auVar81._4_4_ = auVar160._4_4_ * auVar39._4_4_;
          auVar81._8_4_ = auVar160._8_4_ * auVar39._8_4_;
          auVar81._12_4_ = auVar160._12_4_ * auVar39._12_4_;
          pfVar2 = (float *)(uVar18 + 0x80 + local_12f8);
          pfVar1 = (float *)(uVar18 + 0x20 + local_12f8);
          auVar89._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar89._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar89._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar89._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar39 = vsubps_avx(auVar89,auVar134._0_16_);
          auVar90._0_4_ = auVar170._0_4_ * auVar39._0_4_;
          auVar90._4_4_ = auVar170._4_4_ * auVar39._4_4_;
          auVar90._8_4_ = auVar170._8_4_ * auVar39._8_4_;
          auVar90._12_4_ = auVar170._12_4_ * auVar39._12_4_;
          auVar39 = vminps_avx(auVar81,auVar90);
          auVar63 = vminps_avx(auVar37._0_16_,auVar66);
          auVar39 = vminps_avx(auVar63,auVar39);
          if (((uint)uVar30 & 7) == 6) {
            auVar63 = vcmpps_avx(auVar32,auVar39,2);
            auVar39 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar38,2);
            auVar38 = vcmpps_avx(auVar38,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
            auVar39 = vandps_avx(auVar39,auVar38);
            auVar39 = vandps_avx(auVar39,auVar63);
          }
          else {
            auVar39 = vcmpps_avx(auVar32,auVar39,2);
          }
          auVar39 = vpslld_avx(auVar39,0x1f);
          uVar28 = vmovmskps_avx(auVar39);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar28);
          local_10c0._0_16_ = auVar32;
        }
        if ((uVar30 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar17 = 4;
          }
          else {
            uVar18 = uVar30 & 0xfffffffffffffff0;
            lVar21 = 0;
            if (unaff_R12 != 0) {
              for (; (unaff_R12 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            iVar17 = 0;
            uVar30 = *(ulong *)(uVar18 + lVar21 * 8);
            uVar25 = unaff_R12 - 1 & unaff_R12;
            if (uVar25 != 0) {
              uVar16 = *(uint *)(local_10c0 + lVar21 * 4);
              lVar21 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar18 + lVar21 * 8);
              uVar7 = *(uint *)(local_10c0 + lVar21 * 4);
              uVar25 = uVar25 - 1 & uVar25;
              uVar24 = local_1398;
              uVar27 = local_13a0;
              if (uVar25 == 0) {
                if (uVar16 < uVar7) {
                  *(ulong *)*pauVar23 = uVar8;
                  *(uint *)(*pauVar23 + 8) = uVar7;
                  pauVar23 = pauVar23 + 1;
                }
                else {
                  *(ulong *)*pauVar23 = uVar30;
                  *(uint *)(*pauVar23 + 8) = uVar16;
                  pauVar23 = pauVar23 + 1;
                  uVar30 = uVar8;
                }
              }
              else {
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar30;
                auVar32 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar16));
                auVar49._8_8_ = 0;
                auVar49._0_8_ = uVar8;
                auVar39 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar7));
                lVar21 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                auVar67._8_8_ = 0;
                auVar67._0_8_ = *(ulong *)(uVar18 + lVar21 * 8);
                auVar38 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
                auVar63 = vpcmpgtd_avx(auVar39,auVar32);
                uVar25 = uVar25 - 1 & uVar25;
                if (uVar25 == 0) {
                  auVar64 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar39,auVar32,auVar64);
                  auVar32 = vblendvps_avx(auVar32,auVar39,auVar64);
                  auVar39 = vpcmpgtd_avx(auVar38,auVar63);
                  auVar64 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar38,auVar63,auVar64);
                  auVar63 = vblendvps_avx(auVar63,auVar38,auVar64);
                  auVar38 = vpcmpgtd_avx(auVar63,auVar32);
                  auVar64 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar63,auVar32,auVar64);
                  auVar32 = vblendvps_avx(auVar32,auVar63,auVar64);
                  *pauVar23 = auVar32;
                  pauVar23[1] = auVar38;
                  uVar30 = auVar39._0_8_;
                  pauVar23 = pauVar23 + 2;
                }
                else {
                  lVar21 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                    }
                  }
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = *(ulong *)(uVar18 + lVar21 * 8);
                  auVar65 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
                  auVar64 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar39,auVar32,auVar64);
                  auVar32 = vblendvps_avx(auVar32,auVar39,auVar64);
                  auVar39 = vpcmpgtd_avx(auVar65,auVar38);
                  auVar64 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar65,auVar38,auVar64);
                  auVar38 = vblendvps_avx(auVar38,auVar65,auVar64);
                  auVar64 = vpcmpgtd_avx(auVar38,auVar32);
                  auVar65 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar38,auVar32,auVar65);
                  auVar32 = vblendvps_avx(auVar32,auVar38,auVar65);
                  auVar38 = vpcmpgtd_avx(auVar39,auVar63);
                  auVar65 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar39,auVar63,auVar65);
                  auVar39 = vblendvps_avx(auVar63,auVar39,auVar65);
                  auVar63 = vpcmpgtd_avx(auVar64,auVar39);
                  auVar65 = vpshufd_avx(auVar63,0xaa);
                  auVar63 = vblendvps_avx(auVar64,auVar39,auVar65);
                  auVar39 = vblendvps_avx(auVar39,auVar64,auVar65);
                  *pauVar23 = auVar32;
                  pauVar23[1] = auVar39;
                  pauVar23[2] = auVar63;
                  auVar105 = ZEXT1664(local_1280);
                  uVar30 = auVar38._0_8_;
                  pauVar23 = pauVar23 + 3;
                }
              }
            }
          }
        }
        else {
          iVar17 = 6;
        }
      } while (iVar17 == 0);
    } while (iVar17 != 6);
    lVar21 = (ulong)((uint)uVar30 & 0xf) - 8;
    if (lVar21 != 0) {
      uVar30 = uVar30 & 0xfffffffffffffff0;
      lVar26 = 0;
      local_1328 = unaff_R12;
      do {
        lVar31 = lVar26 * 0x140;
        fVar3 = *(float *)(ray + k * 4 + 0xe0);
        pfVar2 = (float *)(uVar30 + 0x90 + lVar31);
        pfVar1 = (float *)(uVar30 + lVar31);
        auVar158._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar158._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar158._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar158._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xa0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x10 + lVar31);
        auVar50._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar50._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar50._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar50._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xb0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x20 + lVar31);
        auVar142._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar142._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar142._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar142._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xc0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x30 + lVar31);
        auVar82._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar82._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar82._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar82._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xd0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x40 + lVar31);
        auVar92._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar92._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar92._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar92._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xe0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x50 + lVar31);
        auVar41._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar41._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar41._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar41._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0xf0 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x60 + lVar31);
        auVar169._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar169._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar169._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar169._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar2 = (float *)(uVar30 + 0x100 + lVar31);
        pfVar1 = (float *)(uVar30 + 0x70 + lVar31);
        auVar119._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar119._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar119._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar119._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        pfVar1 = (float *)(uVar30 + 0x110 + lVar31);
        pfVar2 = (float *)(uVar30 + 0x80 + lVar31);
        auVar131._0_4_ = fVar3 * *pfVar1 + *pfVar2;
        auVar131._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
        auVar131._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
        auVar131._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
        uVar28 = *(undefined4 *)(ray + k * 4);
        auVar136._4_4_ = uVar28;
        auVar136._0_4_ = uVar28;
        auVar136._8_4_ = uVar28;
        auVar136._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar147._4_4_ = uVar28;
        auVar147._0_4_ = uVar28;
        auVar147._8_4_ = uVar28;
        auVar147._12_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar151._4_4_ = uVar28;
        auVar151._0_4_ = uVar28;
        auVar151._8_4_ = uVar28;
        auVar151._12_4_ = uVar28;
        auVar32 = vsubps_avx(auVar158,auVar136);
        local_1360 = vsubps_avx(auVar50,auVar147);
        local_1320 = vsubps_avx(auVar142,auVar151);
        auVar39 = vsubps_avx(auVar82,auVar136);
        auVar63 = vsubps_avx(auVar92,auVar147);
        auVar38 = vsubps_avx(auVar41,auVar151);
        auVar64 = vsubps_avx(auVar169,auVar136);
        auVar65 = vsubps_avx(auVar119,auVar147);
        auVar66 = vsubps_avx(auVar131,auVar151);
        local_10d0 = vsubps_avx(auVar64,auVar32);
        local_10e0 = vsubps_avx(auVar65,local_1360);
        local_10f0 = vsubps_avx(auVar66,local_1320);
        fVar3 = local_1360._0_4_;
        fVar77 = auVar65._0_4_ + fVar3;
        fVar5 = local_1360._4_4_;
        fVar85 = auVar65._4_4_ + fVar5;
        fVar75 = local_1360._8_4_;
        fVar86 = auVar65._8_4_ + fVar75;
        fVar109 = local_1360._12_4_;
        fVar87 = auVar65._12_4_ + fVar109;
        fVar156 = local_1320._0_4_;
        fVar88 = fVar156 + auVar66._0_4_;
        fVar161 = local_1320._4_4_;
        fVar97 = fVar161 + auVar66._4_4_;
        fVar163 = local_1320._8_4_;
        fVar98 = fVar163 + auVar66._8_4_;
        fVar165 = local_1320._12_4_;
        fVar99 = fVar165 + auVar66._12_4_;
        fVar48 = local_10f0._0_4_;
        auVar120._0_4_ = fVar77 * fVar48;
        fVar60 = local_10f0._4_4_;
        auVar120._4_4_ = fVar85 * fVar60;
        fVar61 = local_10f0._8_4_;
        auVar120._8_4_ = fVar86 * fVar61;
        fVar62 = local_10f0._12_4_;
        auVar120._12_4_ = fVar87 * fVar62;
        fVar167 = local_10e0._0_4_;
        auVar132._0_4_ = fVar167 * fVar88;
        fVar171 = local_10e0._4_4_;
        auVar132._4_4_ = fVar171 * fVar97;
        fVar173 = local_10e0._8_4_;
        auVar132._8_4_ = fVar173 * fVar98;
        fVar175 = local_10e0._12_4_;
        auVar132._12_4_ = fVar175 * fVar99;
        auVar78 = vsubps_avx(auVar132,auVar120);
        fVar4 = auVar32._0_4_;
        fVar118 = auVar64._0_4_ + fVar4;
        fVar10 = auVar32._4_4_;
        fVar128 = auVar64._4_4_ + fVar10;
        fVar76 = auVar32._8_4_;
        fVar129 = auVar64._8_4_ + fVar76;
        fVar117 = auVar32._12_4_;
        fVar130 = auVar64._12_4_ + fVar117;
        fVar135 = local_10d0._0_4_;
        auVar93._0_4_ = fVar135 * fVar88;
        fVar138 = local_10d0._4_4_;
        auVar93._4_4_ = fVar138 * fVar97;
        fVar139 = local_10d0._8_4_;
        auVar93._8_4_ = fVar139 * fVar98;
        fVar140 = local_10d0._12_4_;
        auVar93._12_4_ = fVar140 * fVar99;
        auVar133._0_4_ = fVar118 * fVar48;
        auVar133._4_4_ = fVar128 * fVar60;
        auVar133._8_4_ = fVar129 * fVar61;
        auVar133._12_4_ = fVar130 * fVar62;
        auVar79 = vsubps_avx(auVar133,auVar93);
        auVar121._0_4_ = fVar118 * fVar167;
        auVar121._4_4_ = fVar128 * fVar171;
        auVar121._8_4_ = fVar129 * fVar173;
        auVar121._12_4_ = fVar130 * fVar175;
        auVar83._0_4_ = fVar135 * fVar77;
        auVar83._4_4_ = fVar138 * fVar85;
        auVar83._8_4_ = fVar139 * fVar86;
        auVar83._12_4_ = fVar140 * fVar87;
        auVar80 = vsubps_avx(auVar83,auVar121);
        local_1370._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        local_1390._4_4_ = *(float *)(ray + k * 4 + 0xa0);
        local_1380._4_4_ = *(float *)(ray + k * 4 + 0x80);
        local_1270._0_4_ =
             auVar78._0_4_ * local_1380._4_4_ +
             local_1370._4_4_ * auVar80._0_4_ + local_1390._4_4_ * auVar79._0_4_;
        local_1270._4_4_ =
             auVar78._4_4_ * local_1380._4_4_ +
             local_1370._4_4_ * auVar80._4_4_ + local_1390._4_4_ * auVar79._4_4_;
        local_1270._8_4_ =
             auVar78._8_4_ * local_1380._4_4_ +
             local_1370._4_4_ * auVar80._8_4_ + local_1390._4_4_ * auVar79._8_4_;
        local_1270._12_4_ =
             auVar78._12_4_ * local_1380._4_4_ +
             local_1370._4_4_ * auVar80._12_4_ + local_1390._4_4_ * auVar79._12_4_;
        local_1100 = vsubps_avx(local_1360,auVar63);
        auVar78 = vsubps_avx(local_1320,auVar38);
        fVar77 = auVar63._0_4_ + fVar3;
        fVar85 = auVar63._4_4_ + fVar5;
        fVar86 = auVar63._8_4_ + fVar75;
        fVar87 = auVar63._12_4_ + fVar109;
        fVar88 = fVar156 + auVar38._0_4_;
        fVar97 = fVar161 + auVar38._4_4_;
        fVar98 = fVar163 + auVar38._8_4_;
        fVar99 = fVar165 + auVar38._12_4_;
        fVar168 = auVar78._0_4_;
        auVar159._0_4_ = fVar168 * fVar77;
        fVar172 = auVar78._4_4_;
        auVar159._4_4_ = fVar172 * fVar85;
        fVar174 = auVar78._8_4_;
        auVar159._8_4_ = fVar174 * fVar86;
        fVar176 = auVar78._12_4_;
        auVar159._12_4_ = fVar176 * fVar87;
        fVar149 = local_1100._0_4_;
        auVar68._0_4_ = fVar149 * fVar88;
        fVar153 = local_1100._4_4_;
        auVar68._4_4_ = fVar153 * fVar97;
        fVar154 = local_1100._8_4_;
        auVar68._8_4_ = fVar154 * fVar98;
        fVar155 = local_1100._12_4_;
        auVar68._12_4_ = fVar155 * fVar99;
        auVar78 = vsubps_avx(auVar68,auVar159);
        auVar32 = vsubps_avx(auVar32,auVar39);
        fVar141 = auVar32._0_4_;
        auVar94._0_4_ = fVar141 * fVar88;
        fVar144 = auVar32._4_4_;
        auVar94._4_4_ = fVar144 * fVar97;
        fVar145 = auVar32._8_4_;
        auVar94._8_4_ = fVar145 * fVar98;
        fVar146 = auVar32._12_4_;
        auVar94._12_4_ = fVar146 * fVar99;
        fVar88 = auVar39._0_4_ + fVar4;
        fVar97 = auVar39._4_4_ + fVar10;
        fVar98 = auVar39._8_4_ + fVar76;
        fVar99 = auVar39._12_4_ + fVar117;
        auVar122._0_4_ = fVar168 * fVar88;
        auVar122._4_4_ = fVar172 * fVar97;
        auVar122._8_4_ = fVar174 * fVar98;
        auVar122._12_4_ = fVar176 * fVar99;
        auVar32 = vsubps_avx(auVar122,auVar94);
        auVar110._0_4_ = fVar149 * fVar88;
        auVar110._4_4_ = fVar153 * fVar97;
        auVar110._8_4_ = fVar154 * fVar98;
        auVar110._12_4_ = fVar155 * fVar99;
        auVar84._0_4_ = fVar141 * fVar77;
        auVar84._4_4_ = fVar144 * fVar85;
        auVar84._8_4_ = fVar145 * fVar86;
        auVar84._12_4_ = fVar146 * fVar87;
        auVar79 = vsubps_avx(auVar84,auVar110);
        local_1260._0_4_ =
             local_1380._4_4_ * auVar78._0_4_ +
             local_1370._4_4_ * auVar79._0_4_ + local_1390._4_4_ * auVar32._0_4_;
        local_1260._4_4_ =
             local_1380._4_4_ * auVar78._4_4_ +
             local_1370._4_4_ * auVar79._4_4_ + local_1390._4_4_ * auVar32._4_4_;
        local_1260._8_4_ =
             local_1380._4_4_ * auVar78._8_4_ +
             local_1370._4_4_ * auVar79._8_4_ + local_1390._4_4_ * auVar32._8_4_;
        local_1260._12_4_ =
             local_1380._4_4_ * auVar78._12_4_ +
             local_1370._4_4_ * auVar79._12_4_ + local_1390._4_4_ * auVar32._12_4_;
        auVar32 = vsubps_avx(auVar39,auVar64);
        fVar77 = auVar39._0_4_ + auVar64._0_4_;
        fVar85 = auVar39._4_4_ + auVar64._4_4_;
        fVar86 = auVar39._8_4_ + auVar64._8_4_;
        fVar87 = auVar39._12_4_ + auVar64._12_4_;
        auVar39 = vsubps_avx(auVar63,auVar65);
        fVar88 = auVar63._0_4_ + auVar65._0_4_;
        fVar97 = auVar63._4_4_ + auVar65._4_4_;
        fVar98 = auVar63._8_4_ + auVar65._8_4_;
        fVar99 = auVar63._12_4_ + auVar65._12_4_;
        auVar63 = vsubps_avx(auVar38,auVar66);
        fVar100 = auVar38._0_4_ + auVar66._0_4_;
        fVar106 = auVar38._4_4_ + auVar66._4_4_;
        fVar107 = auVar38._8_4_ + auVar66._8_4_;
        fVar108 = auVar38._12_4_ + auVar66._12_4_;
        fVar157 = auVar63._0_4_;
        auVar111._0_4_ = fVar157 * fVar88;
        fVar162 = auVar63._4_4_;
        auVar111._4_4_ = fVar162 * fVar97;
        fVar164 = auVar63._8_4_;
        auVar111._8_4_ = fVar164 * fVar98;
        fVar166 = auVar63._12_4_;
        auVar111._12_4_ = fVar166 * fVar99;
        fVar118 = auVar39._0_4_;
        auVar123._0_4_ = fVar118 * fVar100;
        fVar128 = auVar39._4_4_;
        auVar123._4_4_ = fVar128 * fVar106;
        fVar129 = auVar39._8_4_;
        auVar123._8_4_ = fVar129 * fVar107;
        fVar130 = auVar39._12_4_;
        auVar123._12_4_ = fVar130 * fVar108;
        auVar39 = vsubps_avx(auVar123,auVar111);
        fVar150 = auVar32._0_4_;
        auVar101._0_4_ = fVar150 * fVar100;
        fVar100 = auVar32._4_4_;
        auVar101._4_4_ = fVar100 * fVar106;
        fVar106 = auVar32._8_4_;
        auVar101._8_4_ = fVar106 * fVar107;
        fVar107 = auVar32._12_4_;
        auVar101._12_4_ = fVar107 * fVar108;
        auVar124._0_4_ = fVar157 * fVar77;
        auVar124._4_4_ = fVar162 * fVar85;
        auVar124._8_4_ = fVar164 * fVar86;
        auVar124._12_4_ = fVar166 * fVar87;
        auVar32 = vsubps_avx(auVar124,auVar101);
        auVar51._0_4_ = fVar77 * fVar118;
        auVar51._4_4_ = fVar85 * fVar128;
        auVar51._8_4_ = fVar86 * fVar129;
        auVar51._12_4_ = fVar87 * fVar130;
        auVar69._0_4_ = fVar150 * fVar88;
        auVar69._4_4_ = fVar100 * fVar97;
        auVar69._8_4_ = fVar106 * fVar98;
        auVar69._12_4_ = fVar107 * fVar99;
        auVar63 = vsubps_avx(auVar69,auVar51);
        local_1370._0_4_ = local_1370._4_4_;
        fStack_1368 = local_1370._4_4_;
        fStack_1364 = local_1370._4_4_;
        local_1390._0_4_ = local_1390._4_4_;
        fStack_1388 = local_1390._4_4_;
        fStack_1384 = local_1390._4_4_;
        local_1380._0_4_ = local_1380._4_4_;
        fStack_1378 = local_1380._4_4_;
        fStack_1374 = local_1380._4_4_;
        auVar52._0_4_ =
             local_1380._4_4_ * auVar39._0_4_ +
             local_1370._4_4_ * auVar63._0_4_ + local_1390._4_4_ * auVar32._0_4_;
        auVar52._4_4_ =
             local_1380._4_4_ * auVar39._4_4_ +
             local_1370._4_4_ * auVar63._4_4_ + local_1390._4_4_ * auVar32._4_4_;
        auVar52._8_4_ =
             local_1380._4_4_ * auVar39._8_4_ +
             local_1370._4_4_ * auVar63._8_4_ + local_1390._4_4_ * auVar32._8_4_;
        auVar52._12_4_ =
             local_1380._4_4_ * auVar39._12_4_ +
             local_1370._4_4_ * auVar63._12_4_ + local_1390._4_4_ * auVar32._12_4_;
        local_1250._0_4_ = auVar52._0_4_ + local_1270._0_4_ + local_1260._0_4_;
        local_1250._4_4_ = auVar52._4_4_ + local_1270._4_4_ + local_1260._4_4_;
        local_1250._8_4_ = auVar52._8_4_ + local_1270._8_4_ + local_1260._8_4_;
        local_1250._12_4_ = auVar52._12_4_ + local_1270._12_4_ + local_1260._12_4_;
        auVar32 = vminps_avx(local_1270,local_1260);
        auVar32 = vminps_avx(auVar32,auVar52);
        auVar102._8_4_ = 0x7fffffff;
        auVar102._0_8_ = 0x7fffffff7fffffff;
        auVar102._12_4_ = 0x7fffffff;
        local_1130 = vandps_avx(local_1250,auVar102);
        auVar103._0_4_ = local_1130._0_4_ * 1.1920929e-07;
        auVar103._4_4_ = local_1130._4_4_ * 1.1920929e-07;
        auVar103._8_4_ = local_1130._8_4_ * 1.1920929e-07;
        auVar103._12_4_ = local_1130._12_4_ * 1.1920929e-07;
        uVar19 = CONCAT44(auVar103._4_4_,auVar103._0_4_);
        auVar112._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar112._8_4_ = -auVar103._8_4_;
        auVar112._12_4_ = -auVar103._12_4_;
        auVar32 = vcmpps_avx(auVar32,auVar112,5);
        local_1110 = local_1270;
        local_1120 = local_1260;
        auVar39 = vmaxps_avx(local_1270,local_1260);
        auVar39 = vmaxps_avx(auVar39,auVar52);
        auVar39 = vcmpps_avx(auVar39,auVar103,2);
        auVar32 = vorps_avx(auVar32,auVar39);
        if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar32[0xf] < '\0') {
          auVar53._0_4_ = fVar149 * fVar48;
          auVar53._4_4_ = fVar153 * fVar60;
          auVar53._8_4_ = fVar154 * fVar61;
          auVar53._12_4_ = fVar155 * fVar62;
          auVar70._0_4_ = fVar168 * fVar167;
          auVar70._4_4_ = fVar172 * fVar171;
          auVar70._8_4_ = fVar174 * fVar173;
          auVar70._12_4_ = fVar176 * fVar175;
          auVar38 = vsubps_avx(auVar70,auVar53);
          auVar104._0_4_ = fVar118 * fVar168;
          auVar104._4_4_ = fVar128 * fVar172;
          auVar104._8_4_ = fVar129 * fVar174;
          auVar104._12_4_ = fVar130 * fVar176;
          auVar113._0_4_ = fVar149 * fVar157;
          auVar113._4_4_ = fVar153 * fVar162;
          auVar113._8_4_ = fVar154 * fVar164;
          auVar113._12_4_ = fVar155 * fVar166;
          auVar64 = vsubps_avx(auVar113,auVar104);
          auVar125._8_4_ = 0x7fffffff;
          auVar125._0_8_ = 0x7fffffff7fffffff;
          auVar125._12_4_ = 0x7fffffff;
          auVar39 = vandps_avx(auVar125,auVar53);
          auVar63 = vandps_avx(auVar125,auVar104);
          auVar39 = vcmpps_avx(auVar39,auVar63,1);
          local_11f0 = vblendvps_avx(auVar64,auVar38,auVar39);
          auVar42._0_4_ = fVar141 * fVar157;
          auVar42._4_4_ = fVar144 * fVar162;
          auVar42._8_4_ = fVar145 * fVar164;
          auVar42._12_4_ = fVar146 * fVar166;
          auVar54._0_4_ = fVar141 * fVar48;
          auVar54._4_4_ = fVar144 * fVar60;
          auVar54._8_4_ = fVar145 * fVar61;
          auVar54._12_4_ = fVar146 * fVar62;
          auVar71._0_4_ = fVar135 * fVar168;
          auVar71._4_4_ = fVar138 * fVar172;
          auVar71._8_4_ = fVar139 * fVar174;
          auVar71._12_4_ = fVar140 * fVar176;
          auVar38 = vsubps_avx(auVar54,auVar71);
          auVar114._0_4_ = fVar168 * fVar150;
          auVar114._4_4_ = fVar172 * fVar100;
          auVar114._8_4_ = fVar174 * fVar106;
          auVar114._12_4_ = fVar176 * fVar107;
          auVar64 = vsubps_avx(auVar114,auVar42);
          auVar39 = vandps_avx(auVar125,auVar71);
          auVar63 = vandps_avx(auVar125,auVar42);
          auVar39 = vcmpps_avx(auVar39,auVar63,1);
          local_11e0 = vblendvps_avx(auVar64,auVar38,auVar39);
          auVar55._0_4_ = fVar149 * fVar150;
          auVar55._4_4_ = fVar153 * fVar100;
          auVar55._8_4_ = fVar154 * fVar106;
          auVar55._12_4_ = fVar155 * fVar107;
          auVar72._0_4_ = fVar135 * fVar149;
          auVar72._4_4_ = fVar138 * fVar153;
          auVar72._8_4_ = fVar139 * fVar154;
          auVar72._12_4_ = fVar140 * fVar155;
          auVar95._0_4_ = fVar141 * fVar167;
          auVar95._4_4_ = fVar144 * fVar171;
          auVar95._8_4_ = fVar145 * fVar173;
          auVar95._12_4_ = fVar146 * fVar175;
          auVar33._0_4_ = fVar141 * fVar118;
          auVar33._4_4_ = fVar144 * fVar128;
          auVar33._8_4_ = fVar145 * fVar129;
          auVar33._12_4_ = fVar146 * fVar130;
          auVar38 = vsubps_avx(auVar72,auVar95);
          auVar64 = vsubps_avx(auVar33,auVar55);
          auVar39 = vandps_avx(auVar125,auVar95);
          auVar63 = vandps_avx(auVar125,auVar55);
          auVar39 = vcmpps_avx(auVar39,auVar63,1);
          local_11d0 = vblendvps_avx(auVar64,auVar38,auVar39);
          fVar48 = local_11f0._0_4_ * local_1380._4_4_ +
                   local_11d0._0_4_ * local_1370._4_4_ + local_11e0._0_4_ * local_1390._4_4_;
          fVar60 = local_11f0._4_4_ * local_1380._4_4_ +
                   local_11d0._4_4_ * local_1370._4_4_ + local_11e0._4_4_ * local_1390._4_4_;
          fVar61 = local_11f0._8_4_ * local_1380._4_4_ +
                   local_11d0._8_4_ * local_1370._4_4_ + local_11e0._8_4_ * local_1390._4_4_;
          fVar62 = local_11f0._12_4_ * local_1380._4_4_ +
                   local_11d0._12_4_ * local_1370._4_4_ + local_11e0._12_4_ * local_1390._4_4_;
          auVar56._0_4_ = fVar48 + fVar48;
          auVar56._4_4_ = fVar60 + fVar60;
          auVar56._8_4_ = fVar61 + fVar61;
          auVar56._12_4_ = fVar62 + fVar62;
          fVar48 = local_11f0._0_4_ * fVar4 + local_11d0._0_4_ * fVar156 + local_11e0._0_4_ * fVar3;
          fVar60 = local_11f0._4_4_ * fVar10 + local_11d0._4_4_ * fVar161 + local_11e0._4_4_ * fVar5
          ;
          fVar75 = local_11f0._8_4_ * fVar76 +
                   local_11d0._8_4_ * fVar163 + local_11e0._8_4_ * fVar75;
          fVar76 = local_11f0._12_4_ * fVar117 +
                   local_11d0._12_4_ * fVar165 + local_11e0._12_4_ * fVar109;
          auVar39 = vrcpps_avx(auVar56);
          fVar3 = auVar39._0_4_;
          auVar115._0_4_ = auVar56._0_4_ * fVar3;
          fVar4 = auVar39._4_4_;
          auVar115._4_4_ = auVar56._4_4_ * fVar4;
          fVar5 = auVar39._8_4_;
          auVar115._8_4_ = auVar56._8_4_ * fVar5;
          fVar10 = auVar39._12_4_;
          auVar115._12_4_ = auVar56._12_4_ * fVar10;
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = &DAT_3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar126,auVar115);
          fVar109 = fVar3 * auVar39._0_4_;
          fVar117 = fVar4 * auVar39._4_4_;
          fVar61 = fVar5 * auVar39._8_4_;
          fVar62 = fVar10 * auVar39._12_4_;
          local_1200._0_4_ = (fVar48 + fVar48) * (fVar3 + fVar109);
          local_1200._4_4_ = (fVar60 + fVar60) * (fVar4 + fVar117);
          local_1200._8_4_ = (fVar75 + fVar75) * (fVar5 + fVar61);
          local_1200._12_4_ = (fVar76 + fVar76) * (fVar10 + fVar62);
          auVar37 = ZEXT1664(local_1200);
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar73._4_4_ = uVar28;
          auVar73._0_4_ = uVar28;
          auVar73._8_4_ = uVar28;
          auVar73._12_4_ = uVar28;
          auVar39 = vcmpps_avx(auVar73,local_1200,2);
          uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar96._4_4_ = uVar28;
          auVar96._0_4_ = uVar28;
          auVar96._8_4_ = uVar28;
          auVar96._12_4_ = uVar28;
          auVar63 = vcmpps_avx(local_1200,auVar96,2);
          auVar39 = vandps_avx(auVar63,auVar39);
          auVar63 = auVar32 & auVar39;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar32 = vandps_avx(auVar32,auVar39);
            auVar39 = vcmpps_avx(auVar56,_DAT_01feba10,4);
            auVar63 = auVar39 & auVar32;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              local_1340 = vandps_avx(auVar32,auVar39);
              local_1240 = &local_13a1;
              pSVar22 = context->scene;
              auVar32 = vrcpps_avx(local_1250);
              fVar3 = auVar32._0_4_;
              auVar57._0_4_ = local_1250._0_4_ * fVar3;
              fVar4 = auVar32._4_4_;
              auVar57._4_4_ = local_1250._4_4_ * fVar4;
              fVar5 = auVar32._8_4_;
              auVar57._8_4_ = local_1250._8_4_ * fVar5;
              fVar10 = auVar32._12_4_;
              auVar57._12_4_ = local_1250._12_4_ * fVar10;
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = &DAT_3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar32 = vsubps_avx(auVar74,auVar57);
              auVar43._0_4_ = fVar3 + fVar3 * auVar32._0_4_;
              auVar43._4_4_ = fVar4 + fVar4 * auVar32._4_4_;
              auVar43._8_4_ = fVar5 + fVar5 * auVar32._8_4_;
              auVar43._12_4_ = fVar10 + fVar10 * auVar32._12_4_;
              auVar58._8_4_ = 0x219392ef;
              auVar58._0_8_ = 0x219392ef219392ef;
              auVar58._12_4_ = 0x219392ef;
              auVar32 = vcmpps_avx(local_1130,auVar58,5);
              auVar32 = vandps_avx(auVar32,auVar43);
              auVar59._0_4_ = local_1270._0_4_ * auVar32._0_4_;
              auVar59._4_4_ = local_1270._4_4_ * auVar32._4_4_;
              auVar59._8_4_ = local_1270._8_4_ * auVar32._8_4_;
              auVar59._12_4_ = local_1270._12_4_ * auVar32._12_4_;
              local_1220 = vminps_avx(auVar59,auVar74);
              auVar44._0_4_ = local_1260._0_4_ * auVar32._0_4_;
              auVar44._4_4_ = local_1260._4_4_ * auVar32._4_4_;
              auVar44._8_4_ = local_1260._8_4_ * auVar32._8_4_;
              auVar44._12_4_ = local_1260._12_4_ * auVar32._12_4_;
              local_1210 = vminps_avx(auVar44,auVar74);
              auVar45._8_4_ = 0x7f800000;
              auVar45._0_8_ = 0x7f8000007f800000;
              auVar45._12_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar45,local_1200,local_1340);
              auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar39 = vminps_avx(auVar39,auVar32);
              auVar63 = vshufpd_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar63,auVar39);
              auVar39 = vcmpps_avx(auVar32,auVar39,0);
              auVar63 = local_1340 & auVar39;
              auVar32 = local_1340;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar32 = vandps_avx(auVar39,local_1340);
              }
              lVar31 = lVar31 + uVar30;
              uVar28 = vmovmskps_avx(auVar32);
              uVar19 = CONCAT44((int)((ulong)local_1240 >> 0x20),uVar28);
              lVar29 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              auVar35 = ZEXT1632(CONCAT412(fVar62,CONCAT48(fVar61,CONCAT44(fVar117,fVar109))));
              auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
              auVar105 = ZEXT3264(auVar35);
              local_1370 = pSVar22;
              local_1230 = local_1340;
LAB_003ce420:
              uVar16 = *(uint *)(lVar31 + 0x120 + lVar29 * 4);
              pRVar20 = (RayHitK<8> *)(ulong)uVar16;
              pGVar9 = (pSVar22->geometries).items[(long)pRVar20].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1340 + lVar29 * 4) = 0;
                pSVar22 = local_1370;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar28 = *(undefined4 *)(local_1220 + lVar29 * 4);
                  uVar6 = *(undefined4 *)(local_1210 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11f0 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11e0 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11d0 + lVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar28;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar6;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(lVar31 + 0x130 + lVar29 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar16;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  unaff_R12 = local_1328;
                  goto LAB_003ce8e5;
                }
                local_1060 = *(undefined4 *)(local_1220 + lVar29 * 4);
                local_1040 = *(undefined4 *)(local_1210 + lVar29 * 4);
                uVar28 = *(undefined4 *)(lVar31 + 0x130 + lVar29 * 4);
                local_1020._4_4_ = uVar28;
                local_1020._0_4_ = uVar28;
                local_1020._8_4_ = uVar28;
                local_1020._12_4_ = uVar28;
                local_1020._16_4_ = uVar28;
                local_1020._20_4_ = uVar28;
                local_1020._24_4_ = uVar28;
                local_1020._28_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_11f0 + lVar29 * 4);
                local_10c0._4_4_ = uVar28;
                local_10c0._0_4_ = uVar28;
                local_10c0._8_4_ = uVar28;
                local_10c0._12_4_ = uVar28;
                local_10c0._16_4_ = uVar28;
                local_10c0._20_4_ = uVar28;
                local_10c0._24_4_ = uVar28;
                local_10c0._28_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_11e0 + lVar29 * 4);
                local_10a0._4_4_ = uVar28;
                local_10a0._0_4_ = uVar28;
                local_10a0._8_4_ = uVar28;
                local_10a0._12_4_ = uVar28;
                local_10a0._16_4_ = uVar28;
                local_10a0._20_4_ = uVar28;
                local_10a0._24_4_ = uVar28;
                local_10a0._28_4_ = uVar28;
                auStack_ff0 = vpshufd_avx(ZEXT416(uVar16),0);
                uVar28 = *(undefined4 *)(local_11d0 + lVar29 * 4);
                local_1080._4_4_ = uVar28;
                local_1080._0_4_ = uVar28;
                local_1080._8_4_ = uVar28;
                local_1080._12_4_ = uVar28;
                local_1080._16_4_ = uVar28;
                local_1080._20_4_ = uVar28;
                local_1080._24_4_ = uVar28;
                local_1080._28_4_ = uVar28;
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                local_1000 = auStack_ff0;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + lVar29 * 4);
                local_12e0 = *local_1308;
                uStack_12d8 = local_1308[1];
                local_12d0 = *local_1310;
                uStack_12c8 = local_1310[1];
                local_12b0 = &local_12e0;
                local_12a8 = pGVar9->userPtr;
                local_12a0 = context->user;
                local_1290 = &local_10c0;
                local_1288 = 8;
                pRVar20 = (RayHitK<8> *)pGVar9->intersectionFilterN;
                local_1298 = ray;
                if (pRVar20 != (RayHitK<8> *)0x0) {
                  local_1320._0_8_ = pauVar23;
                  local_1380 = lVar21;
                  local_1390 = lVar26;
                  local_1350 = auVar37._0_16_;
                  local_1360._0_4_ = uVar28;
                  auVar35 = ZEXT1632(auVar105._0_16_);
                  pRVar20 = (RayHitK<8> *)(*(code *)pRVar20)(&local_12b0);
                  auVar37 = ZEXT1664(local_1350);
                  auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
                  auVar105 = ZEXT3264(auVar35);
                  lVar21 = local_1380;
                  pauVar23 = (undefined1 (*) [16])local_1320._0_8_;
                  uVar24 = local_1398;
                  lVar26 = local_1390;
                  ray = local_1330;
                  uVar27 = local_13a0;
                  uVar28 = local_1360._0_4_;
                }
                auVar11._8_8_ = uStack_12d8;
                auVar11._0_8_ = local_12e0;
                auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,auVar11);
                auVar13._8_8_ = uStack_12c8;
                auVar13._0_8_ = local_12d0;
                auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,auVar13);
                auVar35._16_16_ = auVar39;
                auVar35._0_16_ = auVar32;
                auVar35 = auVar105._0_32_ & ~auVar35;
                if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar35 >> 0x7f,0) == '\0') &&
                      (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar35 >> 0xbf,0) == '\0') &&
                    (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar35[0x1f]) {
                  auVar36._0_4_ = auVar32._0_4_ ^ auVar105._0_4_;
                  auVar36._4_4_ = auVar32._4_4_ ^ auVar105._4_4_;
                  auVar36._8_4_ = auVar32._8_4_ ^ auVar105._8_4_;
                  auVar36._12_4_ = auVar32._12_4_ ^ auVar105._12_4_;
                  auVar36._16_4_ = auVar39._0_4_ ^ auVar105._16_4_;
                  auVar36._20_4_ = auVar39._4_4_ ^ auVar105._20_4_;
                  auVar36._24_4_ = auVar39._8_4_ ^ auVar105._24_4_;
                  auVar36._28_4_ = auVar39._12_4_ ^ auVar105._28_4_;
                }
                else {
                  pRVar20 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar20 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_1380 = lVar21;
                    local_1390 = lVar26;
                    local_1350 = auVar37._0_16_;
                    local_1360._0_4_ = uVar28;
                    auVar35 = ZEXT1632(auVar105._0_16_);
                    pRVar20 = (RayHitK<8> *)(*(code *)pRVar20)(&local_12b0);
                    auVar37 = ZEXT1664(local_1350);
                    auVar35 = vcmpps_avx(auVar35,auVar35,0xf);
                    auVar105 = ZEXT3264(auVar35);
                    lVar21 = local_1380;
                    uVar24 = local_1398;
                    lVar26 = local_1390;
                    ray = local_1330;
                    uVar27 = local_13a0;
                    uVar28 = local_1360._0_4_;
                  }
                  auVar12._8_8_ = uStack_12d8;
                  auVar12._0_8_ = local_12e0;
                  auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,auVar12);
                  auVar14._8_8_ = uStack_12c8;
                  auVar14._0_8_ = local_12d0;
                  auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,auVar14);
                  auVar47._16_16_ = auVar39;
                  auVar47._0_16_ = auVar32;
                  auVar36._0_4_ = auVar32._0_4_ ^ auVar105._0_4_;
                  auVar36._4_4_ = auVar32._4_4_ ^ auVar105._4_4_;
                  auVar36._8_4_ = auVar32._8_4_ ^ auVar105._8_4_;
                  auVar36._12_4_ = auVar32._12_4_ ^ auVar105._12_4_;
                  auVar36._16_4_ = auVar39._0_4_ ^ auVar105._16_4_;
                  auVar36._20_4_ = auVar39._4_4_ ^ auVar105._20_4_;
                  auVar36._24_4_ = auVar39._8_4_ ^ auVar105._24_4_;
                  auVar36._28_4_ = auVar39._12_4_ ^ auVar105._28_4_;
                  auVar35 = auVar105._0_32_ & ~auVar47;
                  if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar35 >> 0x7f,0) != '\0') ||
                        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar35 >> 0xbf,0) != '\0') ||
                      (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar35[0x1f] < '\0') {
                    auVar35 = vmaskmovps_avx(auVar36,*local_1290);
                    *(undefined1 (*) [32])(local_1298 + 0x180) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[1]);
                    *(undefined1 (*) [32])(local_1298 + 0x1a0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[2]);
                    *(undefined1 (*) [32])(local_1298 + 0x1c0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[3]);
                    *(undefined1 (*) [32])(local_1298 + 0x1e0) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[4]);
                    *(undefined1 (*) [32])(local_1298 + 0x200) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[5]);
                    *(undefined1 (*) [32])(local_1298 + 0x220) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[6]);
                    *(undefined1 (*) [32])(local_1298 + 0x240) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[7]);
                    *(undefined1 (*) [32])(local_1298 + 0x260) = auVar35;
                    auVar35 = vmaskmovps_avx(auVar36,local_1290[8]);
                    *(undefined1 (*) [32])(local_1298 + 0x280) = auVar35;
                    pRVar20 = local_1298;
                  }
                }
                if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar36 >> 0x7f,0) == '\0') &&
                      (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar36 >> 0xbf,0) == '\0') &&
                    (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar36[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
                }
                *(undefined4 *)(local_1340 + lVar29 * 4) = 0;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar34._4_4_ = uVar28;
                auVar34._0_4_ = uVar28;
                auVar34._8_4_ = uVar28;
                auVar34._12_4_ = uVar28;
                auVar32 = vcmpps_avx(auVar37._0_16_,auVar34,2);
                local_1340 = vandps_avx(auVar32,local_1340);
                pSVar22 = local_1370;
              }
              unaff_R12 = local_1328;
              if ((((local_1340 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1340 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1340 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1340[0xf]) goto LAB_003ce8e5;
              auVar46._8_4_ = 0x7f800000;
              auVar46._0_8_ = 0x7f8000007f800000;
              auVar46._12_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar46,auVar37._0_16_,local_1340);
              auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar39 = vminps_avx(auVar39,auVar32);
              auVar63 = vshufpd_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar63,auVar39);
              auVar39 = vcmpps_avx(auVar32,auVar39,0);
              auVar63 = local_1340 & auVar39;
              auVar32 = local_1340;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar32 = vandps_avx(auVar39,local_1340);
              }
              uVar28 = vmovmskps_avx(auVar32);
              uVar19 = CONCAT44((int)((ulong)pRVar20 >> 0x20),uVar28);
              lVar29 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              goto LAB_003ce420;
            }
          }
        }
LAB_003ce8e5:
        lVar26 = lVar26 + 1;
      } while (lVar26 != lVar21);
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar37 = ZEXT1664(CONCAT412(uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))));
    auVar116 = ZEXT1664(local_1140);
    auVar127 = ZEXT1664(local_1150);
    auVar134 = ZEXT1664(local_1160);
    auVar137 = ZEXT1664(local_1170);
    auVar143 = ZEXT1664(local_1180);
    auVar148 = ZEXT1664(local_1190);
    auVar152 = ZEXT1664(local_11a0);
    auVar160 = ZEXT1664(local_11b0);
    auVar170 = ZEXT1664(local_11c0);
    auVar105 = ZEXT1664(local_1280);
    uVar19 = local_1300;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }